

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O3

void linear_free_parent(void *ptr)

{
  void *pvVar1;
  void *ptr_00;
  
  if (ptr != (void *)0x0) {
    if (*(int *)((long)ptr + -0x38) != -0x7846382d) {
      __assert_fail("node->magic == LMAGIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                    ,0x2e1,"void linear_free_parent(void *)");
    }
    ptr_00 = (void *)((long)ptr + -0x38);
    do {
      pvVar1 = *(void **)((long)ptr_00 + 0x18);
      ralloc_free(ptr_00);
      ptr_00 = pvVar1;
    } while (pvVar1 != (void *)0x0);
  }
  return;
}

Assistant:

void
linear_free_parent(void *ptr)
{
   linear_header *node;

   if (unlikely(!ptr))
      return;

   node = LINEAR_PARENT_TO_HEADER(ptr);
   assert(node->magic == LMAGIC);

   while (node) {
      void *ptr = node;

      node = node->next;
      ralloc_free(ptr);
   }
}